

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::buildPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          SimpleGraphicsPipelineBuilder *this,UVec2 *renderSize,VkRenderPass renderPass)

{
  VkPipelineLayout obj;
  DeviceInterface *vk;
  VkDevice device;
  uint uVar1;
  VkPipelineRasterizationStateCreateInfo rasterStateParams;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkRect2D scissor;
  VkPipelineDepthStencilStateCreateInfo depthStencilStateParams;
  VkPipelineTessellationStateCreateInfo tessStateCreateInfo;
  VkViewport viewport;
  VkPipelineColorBlendAttachmentState colorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkGraphicsPipelineCreateInfo graphicsPipelineParams;
  VkPipelineLayout local_2f8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_2f0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  VkVertexInputBindingDescription local_2b8;
  VkRect2D local_2a8;
  VkPipelineDepthStencilStateCreateInfo local_298;
  VkPipelineTessellationStateCreateInfo local_228;
  VkViewport local_210;
  VkPipelineColorBlendAttachmentState local_1f8;
  VkPipelineInputAssemblyStateCreateInfo local_1d8;
  VkVertexInputAttributeDescription local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  VkPipelineMultisampleStateCreateInfo local_198;
  VkPipelineViewportStateCreateInfo local_160;
  VkPipelineVertexInputStateCreateInfo local_130;
  VkPipelineColorBlendStateCreateInfo local_100;
  VkGraphicsPipelineCreateInfo local_c8;
  
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  local_c8.pNext = (void *)0x0;
  local_c8.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)0x0;
  local_c8.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  local_c8.flags = 0;
  local_c8.stageCount = 0;
  local_c8.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  local_c8.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_c8._4_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&local_2f8,vk,device,
             (VkPipelineLayoutCreateInfo *)&local_c8,(VkAllocationCallbacks *)0x0);
  local_298.flags = (VkPipelineDepthStencilStateCreateFlags)DStack_2f0.m_device;
  local_298.depthTestEnable = (VkBool32)((ulong)DStack_2f0.m_device >> 0x20);
  local_298.depthWriteEnable = (VkBool32)DStack_2f0.m_allocator;
  local_298.depthCompareOp = (VkCompareOp)((ulong)DStack_2f0.m_allocator >> 0x20);
  local_298._0_8_ = local_2f8.m_internal;
  local_298.pNext = DStack_2f0.m_deviceIface;
  local_2f8.m_internal = 0;
  DStack_2f0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_2f0.m_device = (VkDevice)0x0;
  DStack_2f0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj);
  }
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(local_298.depthTestEnable,local_298.flags);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)CONCAT44(local_298.depthCompareOp,local_298.depthWriteEnable);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       local_298._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_298.pNext;
  if (local_2f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_2f0,local_2f8);
  }
  local_130.pVertexBindingDescriptions = &local_2b8;
  local_2b8.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_2b8.binding = 0;
  local_2b8.stride = 0x20;
  local_130.pVertexAttributeDescriptions = &local_1b8;
  local_1a8 = 1;
  uStack_1a0 = 0x100000006d;
  local_1b8.location = 0;
  local_1b8.binding = 0;
  local_1b8.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_1b8.offset = 0;
  local_c8.pVertexInputState = &local_130;
  local_130.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_130.pNext = (void *)0x0;
  local_130.flags = 0;
  local_130.vertexBindingDescriptionCount = 1;
  local_130.vertexAttributeDescriptionCount = 2;
  local_228.patchControlPoints = this->m_patchControlPoints;
  uVar1 = 10;
  if (local_228.patchControlPoints == 0) {
    uVar1 = 3;
  }
  local_c8.pInputAssemblyState = &local_1d8;
  local_1d8.pNext = (void *)0x0;
  local_1d8.primitiveRestartEnable = 0;
  local_1d8._28_4_ = 0;
  local_1d8.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_1d8._4_4_ = 0;
  local_1d8._16_8_ = (ulong)uVar1 << 0x20;
  local_160.pViewports = &local_210;
  local_210.x = 0.0;
  local_210.y = 0.0;
  local_2a8.extent.width = renderSize->m_data[0];
  local_210.width = (float)local_2a8.extent.width;
  local_2a8.extent.height = renderSize->m_data[1];
  local_210.height = (float)local_2a8.extent.height;
  local_210.minDepth = 0.0;
  local_210.maxDepth = 1.0;
  local_160.pScissors = &local_2a8;
  local_2a8.offset.x = 0;
  local_2a8.offset.y = 0;
  local_c8.pViewportState = &local_160;
  local_160.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_160.pNext = (void *)0x0;
  local_160.flags = 0;
  local_160.viewportCount = 1;
  local_160.scissorCount = 1;
  DStack_2f0.m_deviceIface = (DeviceInterface *)0x0;
  local_2c8._0_4_ = 0.0;
  local_2c8._4_4_ = 0.0;
  local_2d8._0_4_ = 0;
  local_2d8._4_4_ = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  uStack_2d0._0_4_ = 0;
  uStack_2d0._4_4_ = 0.0;
  DStack_2f0.m_device = (VkDevice)0x0;
  DStack_2f0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_2f8.m_internal = 0x17;
  uStack_2c0._0_4_ = 1.0;
  uStack_2c0._4_4_ = 0;
  local_100.pAttachments = &local_1f8;
  local_1f8.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_1f8.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_1f8.alphaBlendOp = VK_BLEND_OP_ADD;
  local_1f8.colorWriteMask = 0xf;
  local_1f8.blendEnable = 0;
  local_1f8.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_1f8.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_1f8.colorBlendOp = VK_BLEND_OP_ADD;
  local_c8.pColorBlendState = &local_100;
  local_100.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_100.pNext = (void *)0x0;
  local_100.flags = 0;
  local_100.logicOpEnable = 0;
  local_100.logicOp = VK_LOGIC_OP_COPY;
  local_100.attachmentCount = 1;
  local_100.blendConstants[0] = 0.0;
  local_100.blendConstants[1] = 0.0;
  local_100.blendConstants[2] = 0.0;
  local_100.blendConstants[3] = 0.0;
  local_c8.pMultisampleState = &local_198;
  local_198.pNext = (void *)0x0;
  local_198.sampleShadingEnable = 0;
  local_198.minSampleShading = 0.0;
  local_198.pSampleMask = (VkSampleMask *)0x0;
  local_198.alphaToCoverageEnable = 0;
  local_198.alphaToOneEnable = 0;
  local_198.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_198._4_4_ = 0;
  local_198.flags = 0;
  local_198.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_c8.pDepthStencilState = &local_298;
  local_298.pNext = (void *)0x0;
  local_298.flags = 0;
  local_298.back.compareOp = VK_COMPARE_OP_NEVER;
  local_298.back.compareMask = 0;
  local_298.back.writeMask = 0;
  local_298.back.reference = 0;
  local_298.front.reference = 0;
  local_298.back.failOp = VK_STENCIL_OP_KEEP;
  local_298.back.passOp = VK_STENCIL_OP_KEEP;
  local_298.back.depthFailOp = VK_STENCIL_OP_KEEP;
  local_298.front.depthFailOp = VK_STENCIL_OP_KEEP;
  local_298.front.compareOp = VK_COMPARE_OP_NEVER;
  local_298.front.compareMask = 0;
  local_298.front.writeMask = 0;
  local_298.depthBoundsTestEnable = 0;
  local_298.stencilTestEnable = 0;
  local_298.front.failOp = VK_STENCIL_OP_KEEP;
  local_298.front.passOp = VK_STENCIL_OP_KEEP;
  local_298.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_298._4_4_ = 0;
  local_298.depthTestEnable = 1;
  local_298.depthWriteEnable = 1;
  local_298.depthCompareOp = VK_COMPARE_OP_LESS_OR_EQUAL;
  local_228.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_228.pNext = (void *)0x0;
  local_228.flags = 0;
  local_c8.pTessellationState = &local_228;
  if (local_228.patchControlPoints == 0) {
    local_c8.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  local_298.minDepthBounds = 0.0;
  local_298.maxDepthBounds = 1.0;
  local_c8.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_c8.pNext = (void *)0x0;
  local_c8._16_8_ = (ulong)this->m_shaderStageCount << 0x20;
  local_c8.pStages = this->m_shaderStageInfo;
  local_c8.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_c8.layout.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  local_c8.subpass = 0;
  local_c8.basePipelineHandle.m_internal = 0;
  local_c8.basePipelineIndex = 0;
  local_c8.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)&local_2f8;
  local_c8.renderPass.m_internal = renderPass.m_internal;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device,(VkPipelineCache)0x0,&local_c8,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> SimpleGraphicsPipelineBuilder::buildPipeline(tcu::UVec2 renderSize, VkRenderPass renderPass)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();
	const VkDevice              vkDevice            = m_context.getDevice();

	// Create pipeline layout
	{
		const VkPipelineLayoutCreateInfo pipelineLayoutParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,      // VkStructureType                  sType;
			DE_NULL,                                            // const void*                      pNext;
			0u,                                                 // VkPipelineLayoutCreateFlags      flags;
			0u,                                                 // deUint32                         setLayoutCount;
			DE_NULL,                                            // const VkDescriptorSetLayout*     pSetLayouts;
			0u,                                                 // deUint32                         pushConstantRangeCount;
			DE_NULL                                             // const VkPushConstantRange*       pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vk, vkDevice, &pipelineLayoutParams);
	}

	// Create pipeline
	const VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0u,                                 // deUint32                 binding;
		sizeof(Vertex4RGBA),                // deUint32                 strideInBytes;
		VK_VERTEX_INPUT_RATE_VERTEX,        // VkVertexInputRate        inputRate;
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
	{
		{
			0u,                                 // deUint32 location;
			0u,                                 // deUint32 binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,      // VkFormat format;
			0u                                  // deUint32 offsetInBytes;
		},
		{
			1u,                                 // deUint32 location;
			0u,                                 // deUint32 binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,      // VkFormat format;
			DE_OFFSET_OF(Vertex4RGBA, color),   // deUint32 offsetInBytes;
		}
	};

	const VkPipelineVertexInputStateCreateInfo vertexInputStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,      // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineVertexInputStateCreateFlags    flags;
		1u,                                                             // deUint32                                 vertexBindingDescriptionCount;
		&vertexInputBindingDescription,                                 // const VkVertexInputBindingDescription*   pVertexBindingDescriptions;
		2u,                                                             // deUint32                                 vertexAttributeDescriptionCount;
		vertexInputAttributeDescriptions,                               // const VkVertexInputAttributeDescription* pVertexAttributeDescriptions;
	};

	VkPrimitiveTopology primitiveTopology = (m_patchControlPoints > 0) ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST : VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
	const VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,    // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineInputAssemblyStateCreateFlags  flags;
		primitiveTopology,                                              // VkPrimitiveTopology                      topology;
		VK_FALSE,                                                       // VkBool32                                 primitiveRestartEnable;
	};

	const VkViewport viewport =
	{
		0.0f,                       // float    originX;
		0.0f,                       // float    originY;
		(float)renderSize.x(),      // float    width;
		(float)renderSize.y(),      // float    height;
		0.0f,                       // float    minDepth;
		1.0f                        // float    maxDepth;
	};
	const VkRect2D scissor =
	{
		{ 0u, 0u },                                                     // VkOffset2D  offset;
		{ renderSize.x(), renderSize.y() }                              // VkExtent2D  extent;
	};
	const VkPipelineViewportStateCreateInfo viewportStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,          // VkStructureType                      sType;
		DE_NULL,                                                        // const void*                          pNext;
		0u,                                                             // VkPipelineViewportStateCreateFlags   flags;
		1u,                                                             // deUint32                             viewportCount;
		&viewport,                                                      // const VkViewport*                    pViewports;
		1u,                                                             // deUint32                             scissorCount;
		&scissor                                                        // const VkRect2D*                      pScissors;
	};

	const VkPipelineRasterizationStateCreateInfo rasterStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,     // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,                                                       // VkBool32                                 depthClampEnable;
		VK_FALSE,                                                       // VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,                                           // VkPolygonMode                            polygonMode;
		VK_CULL_MODE_NONE,                                              // VkCullModeFlags                          cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,                                // VkFrontFace                              frontFace;
		VK_FALSE,                                                       // VkBool32                                 depthBiasEnable;
		0.0f,                                                           // float                                    depthBiasConstantFactor;
		0.0f,                                                           // float                                    depthBiasClamp;
		0.0f,                                                           // float                                    depthBiasSlopeFactor;
		1.0f,                                                           // float                                    lineWidth;
	};

	const VkPipelineColorBlendAttachmentState colorBlendAttachmentState =
	{
		VK_FALSE,                                                                   // VkBool32                 blendEnable;
		VK_BLEND_FACTOR_ONE,                                                        // VkBlendFactor            srcColorBlendFactor;
		VK_BLEND_FACTOR_ZERO,                                                       // VkBlendFactor            dstColorBlendFactor;
		VK_BLEND_OP_ADD,                                                            // VkBlendOp                colorBlendOp;
		VK_BLEND_FACTOR_ONE,                                                        // VkBlendFactor            srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ZERO,                                                       // VkBlendFactor            dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,                                                            // VkBlendOp                alphaBlendOp;
		VK_COLOR_COMPONENT_R_BIT |
		VK_COLOR_COMPONENT_G_BIT |
		VK_COLOR_COMPONENT_B_BIT |
		VK_COLOR_COMPONENT_A_BIT                                                    // VkColorComponentFlags    colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo colorBlendStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,   // VkStructureType                              sType;
		DE_NULL,                                                    // const void*                                  pNext;
		0u,                                                         // VkPipelineColorBlendStateCreateFlags         flags;
		VK_FALSE,                                                   // VkBool32                                     logicOpEnable;
		VK_LOGIC_OP_COPY,                                           // VkLogicOp                                    logicOp;
		1u,                                                         // deUint32                                     attachmentCount;
		&colorBlendAttachmentState,                                 // const VkPipelineColorBlendAttachmentState*   pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },                                 // float                                        blendConst[4];
	};

	const VkPipelineMultisampleStateCreateInfo  multisampleStateParams  =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,   // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineMultisampleStateCreateFlags    flags;
		VK_SAMPLE_COUNT_1_BIT,                                      // VkSampleCountFlagBits                    rasterizationSamples;
		VK_FALSE,                                                   // VkBool32                                 sampleShadingEnable;
		0.0f,                                                       // float                                    minSampleShading;
		DE_NULL,                                                    // const VkSampleMask*                      pSampleMask;
		VK_FALSE,                                                   // VkBool32                                 alphaToCoverageEnable;
		VK_FALSE,                                                   // VkBool32                                 alphaToOneEnable;
	};

	VkPipelineDepthStencilStateCreateInfo depthStencilStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO, // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineDepthStencilStateCreateFlags   flags;
		VK_TRUE,                                                    // VkBool32                                 depthTestEnable;
		VK_TRUE,                                                    // VkBool32                                 depthWriteEnable;
		VK_COMPARE_OP_LESS_OR_EQUAL,                                // VkCompareOp                              depthCompareOp;
		VK_FALSE,                                                   // VkBool32                                 depthBoundsTestEnable;
		VK_FALSE,                                                   // VkBool32                                 stencilTestEnable;
		// VkStencilOpState front;
		{
			VK_STENCIL_OP_KEEP,     // VkStencilOp  failOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  passOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  depthFailOp;
			VK_COMPARE_OP_NEVER,    // VkCompareOp  compareOp;
			0u,                     // deUint32     compareMask;
			0u,                     // deUint32     writeMask;
			0u,                     // deUint32     reference;
		},
		// VkStencilOpState back;
		{
			VK_STENCIL_OP_KEEP,     // VkStencilOp  failOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  passOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  depthFailOp;
			VK_COMPARE_OP_NEVER,    // VkCompareOp  compareOp;
			0u,                     // deUint32     compareMask;
			0u,                     // deUint32     writeMask;
			0u,                     // deUint32     reference;
		},
		0.0f,                                                      // float                                    minDepthBounds;
		1.0f,                                                      // float                                    maxDepthBounds;
	};

	const VkPipelineTessellationStateCreateInfo*	pTessCreateInfo		= DE_NULL;
	const VkPipelineTessellationStateCreateInfo		tessStateCreateInfo	=
	{
			VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,  // VkStructureType                          sType;
			DE_NULL,                                                    // const void*                              pNext;
			0u,                                                         // VkPipelineTessellationStateCreateFlags   flags;
			m_patchControlPoints,                                       // deUint32                                 patchControlPoints;
	};

	if (m_patchControlPoints > 0)
		pTessCreateInfo = &tessStateCreateInfo;

	const VkGraphicsPipelineCreateInfo graphicsPipelineParams =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,    // VkStructureType                                  sType;
		DE_NULL,                                            // const void*                                      pNext;
		0u,                                                 // VkPipelineCreateFlags                            flags;
		m_shaderStageCount,                                 // deUint32                                         stageCount;
		m_shaderStageInfo,                                  // const VkPipelineShaderStageCreateInfo*           pStages;
		&vertexInputStateParams,                            // const VkPipelineVertexInputStateCreateInfo*      pVertexInputState;
		&inputAssemblyStateParams,                          // const VkPipelineInputAssemblyStateCreateInfo*    pInputAssemblyState;
		pTessCreateInfo,                                    // const VkPipelineTessellationStateCreateInfo*     pTessellationState;
		&viewportStateParams,                               // const VkPipelineViewportStateCreateInfo*         pViewportState;
		&rasterStateParams,                                 // const VkPipelineRasterizationStateCreateInfo*    pRasterState;
		&multisampleStateParams,                            // const VkPipelineMultisampleStateCreateInfo*      pMultisampleState;
		&depthStencilStateParams,                           // const VkPipelineDepthStencilStateCreateInfo*     pDepthStencilState;
		&colorBlendStateParams,                             // const VkPipelineColorBlendStateCreateInfo*       pColorBlendState;
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,   // const VkPipelineDynamicStateCreateInfo*          pDynamicState;
		*m_pipelineLayout,                                  // VkPipelineLayout                                 layout;
		renderPass,                                         // VkRenderPass                                     renderPass;
		0u,                                                 // deUint32                                         subpass;
		0u,                                                 // VkPipeline                                       basePipelineHandle;
		0,                                                  // deInt32                                          basePipelineIndex;
	};

	return createGraphicsPipeline(vk, vkDevice, DE_NULL, &graphicsPipelineParams);
}